

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O0

void avro::
     codec_traits<std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
     ::encode(Encoder *e,
             vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
             *b)

{
  bool bVar1;
  size_type sVar2;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
  *in_RSI;
  _union_array_union_Union__0__ *in_RDI;
  Encoder *unaff_retaddr;
  const_iterator it;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
  *in_stack_ffffffffffffffc8;
  _union_array_union_Union__0__ *in_stack_ffffffffffffffd0;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
  *in_stack_ffffffffffffffe0;
  __normal_iterator<const_uau::_union_array_union_Union__0___*,_std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
  local_18;
  vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
  *local_10;
  _union_array_union_Union__0__ *t;
  
  local_10 = in_RSI;
  (*(code *)((_union_array_union_Union__0__ *)in_RDI->idx_)[7].idx_)();
  bVar1 = std::
          vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
          ::empty(in_stack_ffffffffffffffe0);
  t = in_RDI;
  if (!bVar1) {
    sVar2 = std::
            vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
            ::size(local_10);
    (*(code *)((_union_array_union_Union__0__ *)in_RDI->idx_)[9].idx_)(in_RDI,sVar2);
    local_18._M_current =
         (_union_array_union_Union__0__ *)
         std::
         vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
         ::begin(in_stack_ffffffffffffffc8);
    while( true ) {
      std::
      vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
      ::end(in_stack_ffffffffffffffc8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_uau::_union_array_union_Union__0___*,_std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
                          *)in_stack_ffffffffffffffd0,
                         (__normal_iterator<const_uau::_union_array_union_Union__0___*,_std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
                          *)in_stack_ffffffffffffffc8);
      if (!bVar1) break;
      in_stack_ffffffffffffffd0 = t;
      (*(code *)((_union_array_union_Union__0__ *)t->idx_)[9].value_.content)();
      t = in_stack_ffffffffffffffd0;
      __gnu_cxx::
      __normal_iterator<const_uau::_union_array_union_Union__0___*,_std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
      ::operator*(&local_18);
      encode<uau::_union_array_union_Union__0__>(unaff_retaddr,t);
      __gnu_cxx::
      __normal_iterator<const_uau::_union_array_union_Union__0___*,_std::vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>_>
      ::operator++(&local_18);
    }
  }
  (*(code *)((_union_array_union_Union__0__ *)t->idx_)[7].value_.content)();
  return;
}

Assistant:

static void encode(Encoder& e, const std::vector<T>& b) {
        e.arrayStart();
        if (! b.empty()) {
            e.setItemCount(b.size());
            for (typename std::vector<T>::const_iterator it = b.begin();
                it != b.end(); ++it) {
                e.startItem();
                avro::encode(e, *it);
            }
        }
        e.arrayEnd();
    }